

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

uint8 * __thiscall
bloaty::Regex::InternalSerializeWithCachedSizesToArray
          (Regex *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  string *psVar2;
  void *pvVar3;
  uint8 *puVar4;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->pattern_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "bloaty.Regex.pattern");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(this->pattern_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->replacement_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "bloaty.Regex.replacement");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->replacement_).ptr_,target);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
  return puVar4;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Regex::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.Regex)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string pattern = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_pattern().data(), static_cast<int>(this->_internal_pattern().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Regex.pattern");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_pattern(), target);
  }

  // optional string replacement = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_replacement().data(), static_cast<int>(this->_internal_replacement().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Regex.replacement");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_replacement(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.Regex)
  return target;
}